

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O2

bool __thiscall RenX_RelayPlugin::initialize(RenX_RelayPlugin *this)

{
  undefined1 *in_config;
  undefined1 uVar1;
  rep rVar2;
  Config *pCVar3;
  Config *in_config_00;
  pointer pbVar4;
  basic_string_view<char,_std::char_traits<char>_> upstream_name;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  upstream_names;
  string_view upstreams_list;
  upstream_settings upstream_settings;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_init_time).__d.__r = rVar2;
  in_config = &this->field_0x38;
  get_settings(&upstream_settings,this,(Config *)in_config);
  RenX_RelayPlugin::upstream_settings::operator=(&this->m_default_settings,&upstream_settings);
  RenX_RelayPlugin::upstream_settings::~upstream_settings(&upstream_settings);
  upstreams_list = (string_view)Jupiter::Config::get(in_config,9,"Upstreams",0,"");
  upstream_settings.m_label._M_dataplus._M_p = (pointer)0x2;
  upstream_settings.m_label._M_string_length = (size_type)anon_var_dwarf_2ea84;
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&upstream_names,&upstreams_list,
             (basic_string_view<char,_std::char_traits<char>_> *)&upstream_settings);
  for (pbVar4 = upstream_names.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 != upstream_names.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
    upstream_name._M_len._0_4_ = (undefined4)pbVar4->_M_len;
    upstream_name._M_len._4_4_ = *(undefined4 *)((long)&pbVar4->_M_len + 4);
    upstream_name._M_str._0_4_ = *(undefined4 *)&pbVar4->_M_str;
    upstream_name._M_str._4_4_ = *(undefined4 *)((long)&pbVar4->_M_str + 4);
    pCVar3 = (Config *)Jupiter::Config::getSection(in_config,pbVar4->_M_len,pbVar4->_M_str);
    in_config_00 = (Config *)in_config;
    if (pCVar3 != (Config *)0x0) {
      in_config_00 = pCVar3;
    }
    get_settings(&upstream_settings,this,in_config_00);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&upstream_settings,&upstream_name);
    std::
    vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
    ::emplace_back<RenX_RelayPlugin::upstream_settings>
              (&this->m_configured_upstreams,&upstream_settings);
    RenX_RelayPlugin::upstream_settings::~upstream_settings(&upstream_settings);
  }
  if ((this->m_configured_upstreams).
      super__Vector_base<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_configured_upstreams).
      super__Vector_base<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = 0;
  }
  else {
    uVar1 = Jupiter::Plugin::initialize();
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&upstream_names.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return (bool)uVar1;
}

Assistant:

bool RenX_RelayPlugin::initialize() {
	m_init_time = std::chrono::steady_clock::now();
	// TODO: add BindHost, BindPort
	// TODO: invent a way to send a custom hostname directly to the devbot, rather than having to rely on manual configuration
	// TODO: Add bidirectional relay support (i.e: bot link)
	// TODO: Add game data relay support (so players connect through this)
	// 			* Drop packets for non-players when traffic spikes
	//			* notify game server to set failover

	m_default_settings = get_settings(config);

	std::string_view upstreams_list = config.get("Upstreams"sv, ""sv);
	std::vector<std::string_view> upstream_names = jessilib::word_split_view(upstreams_list, WHITESPACE_SV);
	for (auto upstream_name : upstream_names) {
		auto upstream_config = config.getSection(upstream_name);
		if (upstream_config == nullptr) {
			upstream_config = &config;
		}

		auto upstream_settings = get_settings(*upstream_config);
		upstream_settings.m_label = upstream_name;
		m_configured_upstreams.push_back(std::move(upstream_settings));
	}

	return !m_configured_upstreams.empty() && RenX::Plugin::initialize();
}